

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall
bloaty::RangeMapTest_AddRange_Test::RangeMapTest_AddRange_Test(RangeMapTest_AddRange_Test *this)

{
  RangeMapTest::RangeMapTest(&this->super_RangeMapTest);
  (this->super_RangeMapTest).super_Test._vptr_Test = (_func_int **)&PTR__RangeMapTest_005fc970;
  return;
}

Assistant:

TEST_F(RangeMapTest, AddRange) {
  CheckConsistency();
  AssertMainMapEquals({});

  map_.AddRange(4, 3, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"}
  });

  map_.AddRange(30, 5, "bar");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {30, 35, kNoTranslation, "bar"}
  });

  map_.AddRange(50, 0, "baz");  // No-op due to 0 size.
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {30, 35, kNoTranslation, "bar"}
  });

  map_.AddRange(20, 5, "baz");
  map_.AddRange(25, 5, "baz2");
  map_.AddRange(40, 5, "quux");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {40, 45, kNoTranslation, "quux"}
  });

  map_.AddRange(21, 25, "overlapping");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {35, 40, kNoTranslation, "overlapping"},
    {40, 45, kNoTranslation, "quux"},
    {45, 46, kNoTranslation, "overlapping"}
  });

  map_.AddRange(21, 25, "overlapping no-op");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {35, 40, kNoTranslation, "overlapping"},
    {40, 45, kNoTranslation, "quux"},
    {45, 46, kNoTranslation, "overlapping"}
  });

  map_.AddRange(0, 100, "overlap everything");
  CheckConsistency();
  AssertMainMapEquals({
    {0, 4, kNoTranslation, "overlap everything"},
    {4, 7, kNoTranslation, "foo"},
    {7, 20, kNoTranslation, "overlap everything"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {35, 40, kNoTranslation, "overlapping"},
    {40, 45, kNoTranslation, "quux"},
    {45, 46, kNoTranslation, "overlapping"},
    {46, 100, kNoTranslation, "overlap everything"},
  });
}